

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void google::protobuf::compiler::java::anon_unknown_8::SetPrimitiveVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,ClassNameResolver *name_resolver,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,Context *context)

{
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  *prVar1;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *field;
  FieldDescriptor *pFVar2;
  bool bVar3;
  uint32_t x;
  int field_number;
  Type TVar4;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar5;
  Options *pOVar6;
  size_t x_00;
  char *pcVar7;
  FieldOptions *this;
  AlphaNum *pAVar8;
  char *b;
  int bitIndex;
  int bitIndex_00;
  int bitIndex_01;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  undefined1 cap_next_letter;
  undefined7 uVar9;
  string_view input;
  string_view s;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_ff0;
  AlphaNum local_fd8;
  AlphaNum local_fa8;
  AlphaNum local_f78;
  string local_f48;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f28;
  AlphaNum local_ef8;
  AlphaNum local_ec8;
  AlphaNum local_e98;
  string local_e68;
  AlphaNum local_e48;
  AlphaNum local_e18;
  AlphaNum local_de8;
  string local_db8;
  AlphaNum local_d98;
  AlphaNum local_d68;
  AlphaNum local_d38;
  string local_d08;
  string local_ce8;
  AlphaNum local_cc8;
  string local_c98;
  AlphaNum local_c78;
  string local_c48;
  AlphaNum local_c28;
  string local_bf8;
  AlphaNum local_bd8;
  string local_ba8;
  AlphaNum local_b88;
  string local_b58;
  int local_b34;
  undefined1 local_b30 [4];
  int fixed_size;
  undefined1 local_b00 [16];
  string local_af0;
  AlphaNum local_ad0;
  string local_aa0;
  AlphaNum local_a80;
  AlphaNum local_a50;
  string local_a20;
  AlphaNum local_a00;
  AlphaNum local_9d0;
  string local_9a0;
  AlphaNum local_980;
  AlphaNum local_950;
  string local_920;
  AlphaNum local_900;
  AlphaNum local_8d0;
  string local_8a0;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_880;
  AlphaNum local_868;
  AlphaNum local_838;
  AlphaNum local_808;
  string local_7d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7b8;
  AlphaNum local_788;
  AlphaNum local_758;
  AlphaNum local_728;
  string local_6f8;
  AlphaNum local_6d8;
  AlphaNum local_6a8;
  AlphaNum local_678;
  string local_648;
  AlphaNum local_628;
  AlphaNum local_5f8;
  AlphaNum local_5c8;
  string local_598;
  AlphaNum local_578;
  AlphaNum local_548;
  AlphaNum local_518;
  string local_4e8;
  AlphaNum local_4c8;
  AlphaNum local_498;
  string local_468;
  AlphaNum local_448;
  AlphaNum local_418;
  AlphaNum local_3e8;
  string local_3b8;
  AlphaNum local_398;
  AlphaNum local_368;
  AlphaNum local_338;
  string local_308;
  undefined1 local_2e8 [8];
  string name;
  char *local_2c0;
  undefined1 local_2b8 [8];
  string capitalized_type;
  string local_268;
  AlphaNum local_248;
  string local_218;
  allocator<char> local_1f1;
  Options local_1f0;
  string_view local_1a0;
  string local_190 [32];
  undefined1 local_170 [80];
  string local_120;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_100;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  allocator<char> local_b1;
  string_view local_b0;
  string local_a0 [55];
  allocator<char> local_69;
  string_view local_68;
  string local_58 [36];
  JavaType local_34;
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  *prStack_30;
  JavaType javaType;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  ClassNameResolver *name_resolver_local;
  FieldGeneratorInfo *info_local;
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  
  cap_next_letter = SUB81(name_resolver,0);
  uVar9 = (undefined7)((ulong)name_resolver >> 8);
  prStack_30 = (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                *)variables;
  variables_local =
       (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)name_resolver;
  name_resolver_local = (ClassNameResolver *)info;
  info_local._0_4_ = builderBitIndex;
  info_local._4_4_ = messageBitIndex;
  _builderBitIndex_local = descriptor;
  SetCommonFieldVariables(descriptor,info,variables);
  local_34 = GetJavaType(_builderBitIndex_local);
  local_68 = PrimitiveTypeName(local_34);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_58,&local_68,&local_69);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (prStack_30,(key_arg<char[5]> *)0xbe040e);
  std::__cxx11::string::operator=((string *)pbVar5,local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_69);
  local_b0 = BoxedPrimitiveTypeName(local_34);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_a0,&local_b0,&local_b1);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (prStack_30,(key_arg<char[11]> *)"boxed_type");
  std::__cxx11::string::operator=((string *)pbVar5,local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_b1);
  prVar1 = prStack_30;
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (prStack_30,(key_arg<char[5]> *)0xbe040e);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_e8,(char (*) [11])0xaf9f6d,pbVar5);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::insert(&local_100,
           (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)prVar1,&local_e8);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_e8);
  pFVar2 = _builderBitIndex_local;
  field = variables_local;
  pOVar6 = Context::options(context);
  java::Options::Options((Options *)local_170,pOVar6);
  ImmutableDefaultValue_abi_cxx11_
            ((string *)(local_170 + 0x50),(java *)pFVar2,(FieldDescriptor *)field,
             (ClassNameResolver *)local_170,(Options *)CONCAT71(uVar9,cap_next_letter));
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[8],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (prStack_30,(key_arg<char[8]> *)0xb1db32);
  std::__cxx11::string::operator=((string *)pbVar5,(string *)(local_170 + 0x50));
  std::__cxx11::string::~string((string *)(local_170 + 0x50));
  java::Options::~Options((Options *)local_170);
  pFVar2 = _builderBitIndex_local;
  pOVar6 = Context::options(context);
  java::Options::Options(&local_1f0,pOVar6);
  local_1a0 = GetCapitalizedType(pFVar2,true,&local_1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_190,&local_1a0,&local_1f1);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[17],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (prStack_30,(key_arg<char[17]> *)"capitalized_type");
  std::__cxx11::string::operator=((string *)pbVar5,local_190);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_1f1);
  java::Options::~Options(&local_1f0);
  x = protobuf::internal::WireFormat::MakeTag(_builderBitIndex_local);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_248,x);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_218,(lts_20250127 *)&local_248,a);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[4],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (prStack_30,(key_arg<char[4]> *)0xa8ecf7);
  std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  field_number = FieldDescriptor::number(_builderBitIndex_local);
  TVar4 = GetType(_builderBitIndex_local);
  x_00 = protobuf::internal::WireFormat::TagSize(field_number,TVar4);
  absl::lts_20250127::AlphaNum::AlphaNum
            ((AlphaNum *)(capitalized_type.field_2._M_local_buf + 8),x_00);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_268,(lts_20250127 *)(capitalized_type.field_2._M_local_buf + 8),a_00);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[9],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (prStack_30,(key_arg<char[9]> *)"tag_size");
  std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  bVar3 = FieldDescriptor::is_required(_builderBitIndex_local);
  pcVar7 = "false";
  if (bVar3) {
    pcVar7 = "true";
  }
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[9],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (prStack_30,(key_arg<char[9]> *)0xc2c642);
  std::__cxx11::string::operator=((string *)pbVar5,pcVar7);
  join_0x00000010_0x00000000_ = PrimitiveTypeName(local_34);
  input._M_str = (char *)0x1;
  input._M_len = (size_t)local_2c0;
  UnderscoresToCamelCase_abi_cxx11_
            ((string *)local_2b8,(java *)name.field_2._8_8_,input,(bool)cap_next_letter);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (prStack_30,(key_arg<char[5]> *)0xc259cc);
  std::__cxx11::string::string((string *)local_2e8,(string *)pbVar5);
  prVar1 = prStack_30;
  if (local_34 < JAVATYPE_STRING) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_338,"com.google.protobuf.Internal.");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_368,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_398,"List");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_308,(lts_20250127 *)&local_338,&local_368,&local_398,
               (AlphaNum *)CONCAT71(uVar9,cap_next_letter));
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[16],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[16]> *)"field_list_type");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_3e8,"empty");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_418,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_448,"List()");
    pAVar8 = &local_448;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_3b8,(lts_20250127 *)&local_3e8,&local_418,pAVar8,
               (AlphaNum *)CONCAT71(uVar9,cap_next_letter));
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[11]> *)"empty_list");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_498,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_4c8,"_.makeImmutable()");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_468,(lts_20250127 *)&local_498,&local_4c8,pAVar8);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[23],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[23]> *)"make_name_unmodifiable");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_468);
    std::__cxx11::string::~string((string *)&local_468);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_518,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_548,"_.get");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_578,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_4e8,(lts_20250127 *)&local_518,&local_548,&local_578,
               (AlphaNum *)CONCAT71(uVar9,cap_next_letter));
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[13],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[13]> *)"repeated_get");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_5c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_5f8,"_.add");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_628,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_598,(lts_20250127 *)&local_5c8,&local_5f8,&local_628,
               (AlphaNum *)CONCAT71(uVar9,cap_next_letter));
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[13],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[13]> *)"repeated_add");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_598);
    std::__cxx11::string::~string((string *)&local_598);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_678,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_6a8,"_.set");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_6d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_648,(lts_20250127 *)&local_678,&local_6a8,&local_6d8,
               (AlphaNum *)CONCAT71(uVar9,cap_next_letter));
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[13],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[13]> *)"repeated_set");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_648);
    std::__cxx11::string::~string((string *)&local_648);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[11]> *)"visit_type");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)local_2b8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_728,"visit");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_758,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_788,"List");
    pAVar8 = &local_788;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_6f8,(lts_20250127 *)&local_728,&local_758,pAVar8,
               (AlphaNum *)CONCAT71(uVar9,cap_next_letter));
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[16],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[16]> *)"visit_type_list");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_6f8);
    std::__cxx11::string::~string((string *)&local_6f8);
  }
  else {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_808,"com.google.protobuf.Internal.ProtobufList<");
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[11]> *)"boxed_type");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_838,pbVar5);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_868,">");
    pAVar8 = &local_868;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_7d8,(lts_20250127 *)&local_808,&local_838,pAVar8,
               (AlphaNum *)CONCAT71(uVar9,cap_next_letter));
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_7b8,(char (*) [16])"field_list_type",&local_7d8);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::insert(&local_880,
             (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)prVar1,&local_7b8);
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_7b8);
    std::__cxx11::string::~string((string *)&local_7d8);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[11]> *)"empty_list");
    std::__cxx11::string::operator=((string *)pbVar5,"emptyProtobufList()");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_8d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_900,"_.makeImmutable()");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_8a0,(lts_20250127 *)&local_8d0,&local_900,pAVar8);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[23],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[23]> *)"make_name_unmodifiable");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_8a0);
    std::__cxx11::string::~string((string *)&local_8a0);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_950,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_980,"_.get");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_920,(lts_20250127 *)&local_950,&local_980,pAVar8);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[13],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[13]> *)"repeated_get");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_920);
    std::__cxx11::string::~string((string *)&local_920);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_9d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_a00,"_.add");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_9a0,(lts_20250127 *)&local_9d0,&local_a00,pAVar8);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[13],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[13]> *)"repeated_add");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_9a0);
    std::__cxx11::string::~string((string *)&local_9a0);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_a50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_a80,"_.set");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_a20,(lts_20250127 *)&local_a50,&local_a80,pAVar8);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[13],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[13]> *)"repeated_set");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_a20);
    std::__cxx11::string::~string((string *)&local_a20);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[11]> *)"visit_type");
    std::__cxx11::string::operator=((string *)pbVar5,"ByteString");
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[16],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[16]> *)"visit_type_list");
    std::__cxx11::string::operator=((string *)pbVar5,"visitList");
  }
  if (local_34 == JAVATYPE_BYTES) {
    local_b00 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2e8);
    s._M_len = local_b00._8_8_;
    s._M_str = (char *)pAVar8;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_af0,local_b00._0_8_,s);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_ad0,&local_af0);
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)local_b30,"_DEFAULT_VALUE");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_aa0,(lts_20250127 *)&local_ad0,(AlphaNum *)local_b30,pAVar8);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[14]> *)"bytes_default");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_aa0);
    std::__cxx11::string::~string((string *)&local_aa0);
    std::__cxx11::string::~string((string *)&local_af0);
  }
  bVar3 = IsReferenceType(local_34);
  if (bVar3) {
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[11]> *)0xafb6e9);
    std::__cxx11::string::operator=
              ((string *)pbVar5,"  java.lang.Class<?> valueClass = value.getClass();\n");
  }
  else {
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[11]> *)0xafb6e9);
    std::__cxx11::string::operator=((string *)pbVar5,"");
  }
  this = FieldDescriptor::options(_builderBitIndex_local);
  bVar3 = FieldOptions::deprecated(this);
  b = "@java.lang.Deprecated ";
  pcVar7 = "";
  if (bVar3) {
    pcVar7 = "@java.lang.Deprecated ";
  }
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[12],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (prStack_30,(key_arg<char[12]> *)0xb17573);
  std::__cxx11::string::operator=((string *)pbVar5,pcVar7);
  TVar4 = GetType(_builderBitIndex_local);
  local_b34 = FixedSize(TVar4);
  if (local_b34 != -1) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_b88,local_b34);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_b58,(lts_20250127 *)&local_b88,a_01);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[11]> *)"fixed_size");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_b58);
    std::__cxx11::string::~string((string *)&local_b58);
  }
  bVar3 = HasHasbit(_builderBitIndex_local);
  if (bVar3) {
    GenerateSetBit_abi_cxx11_(&local_bf8,(java *)(ulong)info_local._4_4_,bitIndex);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_bd8,&local_bf8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_c28,";");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_ba8,(lts_20250127 *)&local_bd8,&local_c28,(AlphaNum *)b);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[26],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[26]> *)"set_has_field_bit_message");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_ba8);
    std::__cxx11::string::~string((string *)&local_ba8);
    std::__cxx11::string::~string((string *)&local_bf8);
    GenerateClearBit_abi_cxx11_(&local_c98,(java *)(ulong)info_local._4_4_,bitIndex_00);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_c78,&local_c98);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_cc8,";");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_c48,(lts_20250127 *)&local_c78,&local_cc8,(AlphaNum *)b);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[28],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[28]> *)"clear_has_field_bit_message");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_c48);
    std::__cxx11::string::~string((string *)&local_c48);
    std::__cxx11::string::~string((string *)&local_c98);
    GenerateGetBit_abi_cxx11_(&local_ce8,(java *)(ulong)info_local._4_4_,bitIndex_01);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[25],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[25]> *)"is_field_present_message");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_ce8);
    std::__cxx11::string::~string((string *)&local_ce8);
  }
  else {
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[26],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[26]> *)"set_has_field_bit_message");
    std::__cxx11::string::operator=((string *)pbVar5,"");
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[28],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (prStack_30,(key_arg<char[28]> *)"clear_has_field_bit_message");
    std::__cxx11::string::operator=((string *)pbVar5,"");
    TVar4 = FieldDescriptor::type(_builderBitIndex_local);
    prVar1 = prStack_30;
    if (TVar4 == TYPE_DOUBLE) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_e98,"java.lang.Double.doubleToRawLongBits(");
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_ec8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_ef8,"_) != 0");
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_e68,(lts_20250127 *)&local_e98,&local_ec8,&local_ef8,
                 (AlphaNum *)CONCAT71(uVar9,cap_next_letter));
      pbVar5 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               ::
               operator[]<char[25],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                         (prStack_30,(key_arg<char[25]> *)"is_field_present_message");
      std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_e68);
      std::__cxx11::string::~string((string *)&local_e68);
    }
    else if (TVar4 == TYPE_FLOAT) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_de8,"java.lang.Float.floatToRawIntBits(");
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_e18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_e48,"_) != 0");
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_db8,(lts_20250127 *)&local_de8,&local_e18,&local_e48,
                 (AlphaNum *)CONCAT71(uVar9,cap_next_letter));
      pbVar5 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               ::
               operator[]<char[25],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                         (prStack_30,(key_arg<char[25]> *)"is_field_present_message");
      std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_db8);
      std::__cxx11::string::~string((string *)&local_db8);
    }
    else if (TVar4 == TYPE_BYTES) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_d38,"!");
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_d68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_d98,"_.isEmpty()");
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_d08,(lts_20250127 *)&local_d38,&local_d68,&local_d98,
                 (AlphaNum *)CONCAT71(uVar9,cap_next_letter));
      pbVar5 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               ::
               operator[]<char[25],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                         (prStack_30,(key_arg<char[25]> *)"is_field_present_message");
      std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_d08);
      std::__cxx11::string::~string((string *)&local_d08);
    }
    else {
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_f78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_fa8,"_ != ");
      pbVar5 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               ::
               operator[]<char[8],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                         (prStack_30,(key_arg<char[8]> *)0xb1db32);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_fd8,pbVar5);
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_f48,(lts_20250127 *)&local_f78,&local_fa8,&local_fd8,
                 (AlphaNum *)CONCAT71(uVar9,cap_next_letter));
      std::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[25],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_f28,(char (*) [25])"is_field_present_message",&local_f48);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::insert(&local_ff0,
               (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)prVar1,&local_f28);
      std::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_f28);
      std::__cxx11::string::~string((string *)&local_f48);
    }
  }
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[2],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (prStack_30,(key_arg<char[2]> *)0xa24ff9);
  std::__cxx11::string::operator=((string *)pbVar5,"");
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[2],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (prStack_30,(key_arg<char[2]> *)0xb17fa7);
  std::__cxx11::string::operator=((string *)pbVar5,"");
  std::__cxx11::string::~string((string *)local_2e8);
  std::__cxx11::string::~string((string *)local_2b8);
  return;
}

Assistant:

void SetPrimitiveVariables(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    const FieldGeneratorInfo* info, ClassNameResolver* name_resolver,
    absl::flat_hash_map<absl::string_view, std::string>* variables,
    Context* context) {
  SetCommonFieldVariables(descriptor, info, variables);
  JavaType javaType = GetJavaType(descriptor);
  (*variables)["type"] = std::string(PrimitiveTypeName(javaType));
  (*variables)["boxed_type"] = std::string(BoxedPrimitiveTypeName(javaType));
  variables->insert({"field_type", (*variables)["type"]});
  (*variables)["default"] =
      ImmutableDefaultValue(descriptor, name_resolver, context->options());
  (*variables)["capitalized_type"] = std::string(GetCapitalizedType(
      descriptor, /* immutable = */ true, context->options()));
  (*variables)["tag"] =
      absl::StrCat(static_cast<int32_t>(WireFormat::MakeTag(descriptor)));
  (*variables)["tag_size"] = absl::StrCat(
      WireFormat::TagSize(descriptor->number(), GetType(descriptor)));
  (*variables)["required"] = descriptor->is_required() ? "true" : "false";

  std::string capitalized_type = UnderscoresToCamelCase(
      PrimitiveTypeName(javaType), true /* cap_next_letter */);
  std::string name = (*variables)["name"];
  switch (javaType) {
    case JAVATYPE_INT:
    case JAVATYPE_LONG:
    case JAVATYPE_FLOAT:
    case JAVATYPE_DOUBLE:
    case JAVATYPE_BOOLEAN:
      (*variables)["field_list_type"] = absl::StrCat(
          "com.google.protobuf.Internal.", capitalized_type, "List");
      (*variables)["empty_list"] =
          absl::StrCat("empty", capitalized_type, "List()");
      (*variables)["make_name_unmodifiable"] =
          absl::StrCat(name, "_.makeImmutable()");
      (*variables)["repeated_get"] =
          absl::StrCat(name, "_.get", capitalized_type);
      (*variables)["repeated_add"] =
          absl::StrCat(name, "_.add", capitalized_type);
      (*variables)["repeated_set"] =
          absl::StrCat(name, "_.set", capitalized_type);
      (*variables)["visit_type"] = capitalized_type;
      (*variables)["visit_type_list"] =
          absl::StrCat("visit", capitalized_type, "List");
      break;
    default:
      variables->insert(
          {"field_list_type",
           absl::StrCat("com.google.protobuf.Internal.ProtobufList<",
                        (*variables)["boxed_type"], ">")});
      (*variables)["empty_list"] = "emptyProtobufList()";
      (*variables)["make_name_unmodifiable"] =
          absl::StrCat(name, "_.makeImmutable()");
      (*variables)["repeated_get"] = absl::StrCat(name, "_.get");
      (*variables)["repeated_add"] = absl::StrCat(name, "_.add");
      (*variables)["repeated_set"] = absl::StrCat(name, "_.set");
      (*variables)["visit_type"] = "ByteString";
      (*variables)["visit_type_list"] = "visitList";
  }

  if (javaType == JAVATYPE_BYTES) {
    (*variables)["bytes_default"] =
        absl::StrCat(absl::AsciiStrToUpper(name), "_DEFAULT_VALUE");
  }

  if (IsReferenceType(javaType)) {
    // We use `x.getClass()` as a null check because it generates less bytecode
    // than an `if (x == null) { throw ... }` statement.
    (*variables)["null_check"] =
        "  java.lang.Class<?> valueClass = value.getClass();\n";
  } else {
    (*variables)["null_check"] = "";
  }
  // TODO: Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] =
      descriptor->options().deprecated() ? "@java.lang.Deprecated " : "";
  int fixed_size = FixedSize(GetType(descriptor));
  if (fixed_size != -1) {
    (*variables)["fixed_size"] = absl::StrCat(fixed_size);
  }

  if (HasHasbit(descriptor)) {
    // For singular messages and builders, one bit is used for the hasField bit.
    // Note that these have a trailing ";".
    (*variables)["set_has_field_bit_message"] =
        absl::StrCat(GenerateSetBit(messageBitIndex), ";");
    (*variables)["clear_has_field_bit_message"] =
        absl::StrCat(GenerateClearBit(messageBitIndex), ";");

    (*variables)["is_field_present_message"] = GenerateGetBit(messageBitIndex);
  } else {
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["clear_has_field_bit_message"] = "";

    switch (descriptor->type()) {
      case FieldDescriptor::TYPE_BYTES:
        (*variables)["is_field_present_message"] =
            absl::StrCat("!", name, "_.isEmpty()");
        break;
      case FieldDescriptor::TYPE_FLOAT:
        (*variables)["is_field_present_message"] =
            absl::StrCat("java.lang.Float.floatToRawIntBits(", name, "_) != 0");
        break;
      case FieldDescriptor::TYPE_DOUBLE:
        (*variables)["is_field_present_message"] = absl::StrCat(
            "java.lang.Double.doubleToRawLongBits(", name, "_) != 0");
        break;
      default:
        variables->insert(
            {"is_field_present_message",
             absl::StrCat(name, "_ != ", (*variables)["default"])});
        break;
    }
  }

  // Annotations often use { and } variables to denote ranges.
  (*variables)["{"] = "";
  (*variables)["}"] = "";
}